

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID id;
  int iVar1;
  VariableID combined_module_id;
  SPIRFunction *caller;
  CombinedImageSampler *pCVar2;
  size_t sVar3;
  bool bVar4;
  ID id_00;
  ID id_01;
  uint32_t uVar5;
  ulong uVar6;
  SPIRVariable *pSVar7;
  SPIRType *pSVar8;
  CompilerError *pCVar9;
  _Elt_pointer ppSVar10;
  long lVar11;
  SPIRType *pSVar12;
  uint32_t *puVar13;
  uint *args_1;
  long lVar14;
  CombinedImageSampler *pCVar15;
  VariableID image_id;
  uint32_t chain;
  CombinedImageSampler *pCVar16;
  Compiler *pCVar17;
  bool *args_2;
  VariableID sampler_id;
  uint32_t local_60;
  uint32_t result_type;
  ID local_58;
  int local_54;
  uint32_t result_type_1;
  VariableID local_4c;
  VariableID local_48;
  
  uVar6 = (ulong)(opcode - OpAccessChain);
  if (0x2a < opcode - OpAccessChain) {
LAB_00375b9e:
    if (opcode != OpLoad) {
      return true;
    }
    if (length < 3) {
      return false;
    }
    result_type_1 = *args;
    pSVar8 = get<spirv_cross::SPIRType>(this->compiler,result_type_1);
    iVar1 = *(int *)&(pSVar8->super_IVariant).field_0xc;
    if ((iVar1 != 0x12) && ((pSVar8->image).sampled != 1 || iVar1 != 0x10)) {
      return true;
    }
    uVar5 = args[1];
    chain = args[2];
    pCVar17 = this->compiler;
    args_2 = (bool *)&result_type;
    result_type = CONCAT31(result_type._1_3_,1);
    args_1 = &result_type_1;
LAB_00375cbf:
    set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (pCVar17,uVar5,(char (*) [1])0x3930a4,args_1,args_2);
    register_read(this->compiler,uVar5,chain,true);
    return true;
  }
  if ((0x6c040000000U >> (uVar6 & 0x3f) & 1) == 0) {
    if ((7UL >> (uVar6 & 0x3f) & 1) != 0) {
      if (length < 3) {
        return false;
      }
      result_type = *args;
      pSVar8 = get<spirv_cross::SPIRType>(this->compiler,result_type);
      iVar1 = *(int *)&(pSVar8->super_IVariant).field_0xc;
      if (iVar1 == 0x12) {
        pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&result_type_1,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                   ,(allocator *)&local_54);
        CompilerError::CompilerError(pCVar9,(string *)&result_type_1);
        __cxa_throw(pCVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (iVar1 != 0x10) {
        return true;
      }
      if ((pSVar8->image).sampled != 1) {
        return true;
      }
      uVar5 = args[1];
      chain = args[2];
      pCVar17 = this->compiler;
      args_2 = (bool *)&result_type_1;
      result_type_1 = CONCAT31(result_type_1._1_3_,1);
      args_1 = &result_type;
      goto LAB_00375cbf;
    }
    if (uVar6 != 0x15) goto LAB_00375b9e;
    bVar4 = false;
  }
  else {
    pSVar7 = maybe_get_backing_variable(this->compiler,args[2]);
    if (pSVar7 == (SPIRVariable *)0x0) {
      return true;
    }
    pSVar8 = get<spirv_cross::SPIRType>
                       (this->compiler,*(uint32_t *)&(pSVar7->super_IVariant).field_0xc);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc != 0x10) {
      return true;
    }
    if ((pSVar8->image).sampled != 1) {
      return true;
    }
    if ((pSVar8->image).dim == DimBuffer) {
      return true;
    }
    bVar4 = true;
    if (this->compiler->dummy_sampler_id == 0) {
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&result_type_1,
                 "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                 ,(allocator *)&result_type);
      CompilerError::CompilerError(pCVar9,(string *)&result_type_1);
      __cxa_throw(pCVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ppSVar10 = (this->functions).c.
             super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar10 !=
      (this->functions).c.
      super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar10 ==
        (this->functions).c.
        super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar10 = (this->functions).c.
                 super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    caller = ppSVar10[-1];
    if (caller->do_combined_parameters == true) {
      image_id.id = args[2];
      pSVar7 = maybe_get_backing_variable(this->compiler,image_id.id);
      if (pSVar7 != (SPIRVariable *)0x0) {
        image_id.id = (pSVar7->super_IVariant).self.id;
      }
      puVar13 = args + 3;
      if (bVar4) {
        puVar13 = &this->compiler->dummy_sampler_id;
      }
      sampler_id.id = *puVar13;
      pSVar7 = maybe_get_backing_variable(this->compiler,sampler_id.id);
      if (pSVar7 != (SPIRVariable *)0x0) {
        sampler_id.id = (pSVar7->super_IVariant).self.id;
      }
      combined_module_id.id = args[1];
      pSVar8 = get<spirv_cross::SPIRType>(this->compiler,*args);
      register_combined_image_sampler
                (this,caller,combined_module_id,image_id,sampler_id,(pSVar8->image).depth);
    }
  }
  id_00.id = remap_parameter(this,args[2]);
  if (bVar4) {
    pCVar17 = this->compiler;
    id_01.id = pCVar17->dummy_sampler_id;
  }
  else {
    id_01.id = remap_parameter(this,args[3]);
    pCVar17 = this->compiler;
  }
  pCVar2 = (pCVar17->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
           ptr;
  sVar3 = (pCVar17->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  lVar11 = sVar3 * 0xc;
  pCVar16 = pCVar2 + 2;
  for (lVar14 = (long)sVar3 >> 2; 0 < lVar14; lVar14 = lVar14 + -1) {
    if ((pCVar16[-2].image_id.id == id_00.id) && (pCVar16[-2].sampler_id.id == id_01.id)) {
      pCVar15 = pCVar16 + -2;
      goto LAB_00375ce2;
    }
    if ((pCVar16[-1].image_id.id == id_00.id) && (pCVar16[-1].sampler_id.id == id_01.id)) {
      pCVar15 = pCVar16 + -1;
      goto LAB_00375ce2;
    }
    if (((pCVar16->image_id).id == id_00.id) &&
       (pCVar15 = pCVar16, (pCVar16->sampler_id).id == id_01.id)) goto LAB_00375ce2;
    if ((pCVar16[1].image_id.id == id_00.id) && (pCVar16[1].sampler_id.id == id_01.id)) {
      pCVar15 = pCVar16 + 1;
      goto LAB_00375ce2;
    }
    pCVar16 = pCVar16 + 4;
    lVar11 = lVar11 + -0x30;
  }
  lVar11 = lVar11 / 0xc;
  pCVar15 = pCVar16 + -2;
  if (lVar11 == 1) {
LAB_00375ed5:
    if (((pCVar15->image_id).id != id_00.id) || ((pCVar15->sampler_id).id != id_01.id))
    goto LAB_00375ceb;
  }
  else if (lVar11 == 3) {
    if ((pCVar16[-2].image_id.id != id_00.id) || (pCVar16[-2].sampler_id.id != id_01.id)) {
      pCVar15 = pCVar16 + -1;
      goto LAB_00375ec2;
    }
  }
  else {
    if (lVar11 != 2) goto LAB_00375ceb;
LAB_00375ec2:
    if (((pCVar15->image_id).id != id_00.id) || ((pCVar15->sampler_id).id != id_01.id)) {
      pCVar15 = pCVar15 + 1;
      goto LAB_00375ed5;
    }
  }
LAB_00375ce2:
  if (pCVar15 != pCVar2 + sVar3) {
    return true;
  }
LAB_00375ceb:
  if (bVar4) {
    local_60 = ParsedIR::increase_bound_by(&pCVar17->ir,1);
    pSVar8 = set<spirv_cross::SPIRType>(this->compiler,local_60);
    pSVar12 = expression_type(this->compiler,args[2]);
    SPIRType::operator=(pSVar8,pSVar12);
    (pSVar8->super_IVariant).self.id = local_60;
    *(undefined4 *)&(pSVar8->super_IVariant).field_0xc = 0x11;
    (pSVar8->image).depth = false;
    local_58.id = 0;
  }
  else {
    local_60 = *args;
    local_58.id = args[1];
  }
  uVar5 = ParsedIR::increase_bound_by(&this->compiler->ir,2);
  id.id = uVar5 + 1;
  result_type = uVar5;
  pSVar8 = set<spirv_cross::SPIRType>(this->compiler,uVar5);
  pSVar12 = get<spirv_cross::SPIRType>(this->compiler,local_60);
  SPIRType::operator=(pSVar8,pSVar12);
  pSVar8->pointer = true;
  pSVar8->storage = StorageClassUniformConstant;
  (pSVar8->parent_type).id = uVar5;
  result_type_1 = 0;
  local_54 = 0;
  set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
            (this->compiler,id.id,&result_type,&result_type_1,&local_54);
  if ((((id_01.id != 0) &&
       (bVar4 = ParsedIR::has_decoration(&this->compiler->ir,id_01,DecorationRelaxedPrecision),
       bVar4)) ||
      ((id_00.id != 0 &&
       (bVar4 = ParsedIR::has_decoration(&this->compiler->ir,id_00,DecorationRelaxedPrecision),
       bVar4)))) ||
     ((local_58.id != 0 &&
      (bVar4 = ParsedIR::has_decoration(&this->compiler->ir,local_58,DecorationRelaxedPrecision),
      bVar4)))) {
    ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
  }
  pSVar7 = maybe_get_backing_variable(this->compiler,id_00.id);
  if (pSVar7 != (SPIRVariable *)0x0) {
    pSVar12 = get<spirv_cross::SPIRType>
                        (this->compiler,*(uint32_t *)&(pSVar7->super_IVariant).field_0xc);
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar8->array,&pSVar12->array);
    SmallVector<bool,_8UL>::operator=(&pSVar8->array_size_literal,&pSVar12->array_size_literal);
  }
  result_type_1 = id.id;
  local_4c.id = id_00.id;
  local_48.id = id_01.id;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL>::push_back
            (&this->compiler->combined_image_samplers,(CombinedImageSampler *)&result_type_1);
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}